

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O1

ModuleRunner * __thiscall
wasm::ShellExternalInterface::getImportInstance(ShellExternalInterface *this,Importable *import)

{
  ostream *poVar1;
  iterator iVar2;
  undefined1 local_1a0 [392];
  
  iVar2 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          ::find(&(this->linkedInstances)._M_t,&import->module);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->linkedInstances)._M_t._M_impl.super__Rb_tree_header) {
    return (ModuleRunner *)iVar2._M_node[1]._M_left;
  }
  Fatal::Fatal((Fatal *)local_1a0);
  poVar1 = (ostream *)(local_1a0 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"importGlobals: unknown import: ",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(import->module).super_IString.str._M_str,
             (import->module).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  Fatal::operator<<((Fatal *)local_1a0,
                    (basic_string_view<char,_std::char_traits<char>_> *)&import->base);
  Fatal::~Fatal((Fatal *)local_1a0);
}

Assistant:

ModuleRunner* getImportInstance(Importable* import) {
    auto it = linkedInstances.find(import->module);
    if (it == linkedInstances.end()) {
      Fatal() << "importGlobals: unknown import: " << import->module.str << "."
              << import->base.str;
    }
    return it->second.get();
  }